

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_data_into_fd.c
# Opt level: O2

int archive_read_data_into_fd(archive *a,int fd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  size_t __n;
  long target_offset_00;
  void *__buf;
  uint can_lseek;
  undefined4 in_stack_ffffffffffffff18;
  void *local_e0;
  int64_t target_offset;
  size_t size;
  void *buff;
  stat_conflict st;
  
  iVar2 = __archive_check_magic(a,0xdeb0c5,4,"archive_read_data_into_fd");
  if (iVar2 == -0x1e) {
    iVar3 = -0x1e;
  }
  else {
    iVar2 = fstat(fd,(stat *)&st);
    bVar1 = (st.st_mode & 0xf000) == 0x8000;
    if (bVar1 && iVar2 == 0) {
      local_e0 = (void *)0x0;
    }
    else {
      local_e0 = calloc(1,0x4000);
    }
    can_lseek = (uint)(bVar1 && iVar2 == 0);
    target_offset_00 = 0;
    while (iVar2 = archive_read_data_block(a,&buff,&size,&target_offset), __buf = buff, iVar2 == 0)
    {
      if ((target_offset_00 < target_offset) &&
         (iVar2 = pad_to(a,fd,can_lseek,(size_t)local_e0,(char *)target_offset,target_offset_00,
                         CONCAT44(can_lseek,in_stack_ffffffffffffff18)),
         target_offset_00 = target_offset, iVar2 != 0)) goto LAB_001e8a61;
      for (; size != 0; size = size - sVar4) {
        __n = size;
        if (0xfffff < size) {
          __n = 0x100000;
        }
        sVar4 = write(fd,__buf,__n);
        if (sVar4 < 0) {
          piVar5 = __errno_location();
          archive_set_error(a,*piVar5,"Write error");
          iVar2 = -0x1e;
          goto LAB_001e8a61;
        }
        __buf = (void *)((long)__buf + sVar4);
        target_offset_00 = target_offset_00 + sVar4;
      }
    }
    if (iVar2 == 1) {
      if (target_offset_00 < target_offset) {
        iVar2 = pad_to(a,fd,can_lseek,(size_t)local_e0,(char *)target_offset,target_offset_00,
                       CONCAT44(can_lseek,in_stack_ffffffffffffff18));
        iVar2 = iVar2 + (uint)(iVar2 == 0);
      }
      else {
        iVar2 = 1;
      }
    }
LAB_001e8a61:
    free(local_e0);
    iVar3 = 0;
    if (iVar2 != 1) {
      iVar3 = iVar2;
    }
  }
  return iVar3;
}

Assistant:

int
archive_read_data_into_fd(struct archive *a, int fd)
{
	struct stat st;
	int r, r2;
	const void *buff;
	size_t size, bytes_to_write;
	ssize_t bytes_written;
	int64_t target_offset;
	int64_t actual_offset = 0;
	int can_lseek;
	char *nulls = NULL;
	size_t nulls_size = 16384;

	archive_check_magic(a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_read_data_into_fd");

	can_lseek = (fstat(fd, &st) == 0) && S_ISREG(st.st_mode);
	if (!can_lseek)
		nulls = calloc(1, nulls_size);

	while ((r = archive_read_data_block(a, &buff, &size, &target_offset)) ==
	    ARCHIVE_OK) {
		const char *p = buff;
		if (target_offset > actual_offset) {
			r = pad_to(a, fd, can_lseek, nulls_size, nulls,
			    target_offset, actual_offset);
			if (r != ARCHIVE_OK)
				break;
			actual_offset = target_offset;
		}
		while (size > 0) {
			bytes_to_write = size;
			if (bytes_to_write > MAX_WRITE)
				bytes_to_write = MAX_WRITE;
			bytes_written = write(fd, p, bytes_to_write);
			if (bytes_written < 0) {
				archive_set_error(a, errno, "Write error");
				r = ARCHIVE_FATAL;
				goto cleanup;
			}
			actual_offset += bytes_written;
			p += bytes_written;
			size -= bytes_written;
		}
	}

	if (r == ARCHIVE_EOF && target_offset > actual_offset) {
		r2 = pad_to(a, fd, can_lseek, nulls_size, nulls,
		    target_offset, actual_offset);
		if (r2 != ARCHIVE_OK)
			r = r2;
	}

cleanup:
	free(nulls);
	if (r != ARCHIVE_EOF)
		return (r);
	return (ARCHIVE_OK);
}